

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

bool __thiscall QWidgetPrivate::isAboutToShow(QWidgetPrivate *this)

{
  bool bVar1;
  QWidgetPrivate *this_00;
  QWidget *pQVar2;
  QWidgetPrivate *in_RDI;
  QWidget *parent;
  QWidget *q;
  bool local_29;
  bool local_1;
  
  if ((*(uint *)&(in_RDI->data).field_0x10 >> 10 & 1) == 0) {
    this_00 = (QWidgetPrivate *)q_func(in_RDI);
    bVar1 = QWidget::isHidden((QWidget *)0x36fcb8);
    if (bVar1) {
      local_1 = false;
    }
    else {
      pQVar2 = QWidget::parentWidget((QWidget *)0x36fccf);
      if (pQVar2 == (QWidget *)0x0) {
        local_29 = false;
      }
      else {
        QWidget::d_func((QWidget *)0x36fce6);
        local_29 = isAboutToShow(this_00);
      }
      local_1 = local_29;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool QWidgetPrivate::isAboutToShow() const
{
    if (data.in_show)
        return true;

    Q_Q(const QWidget);
    if (q->isHidden())
        return false;

    // The widget will be shown if any of its ancestors are about to show.
    QWidget *parent = q->parentWidget();
    return parent ? parent->d_func()->isAboutToShow() : false;
}